

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeNotifier.cpp
# Opt level: O0

void __thiscall FileChangeNotifier::NotifyListeners(FileChangeNotifier *this)

{
  IFileChangeListener *pIVar1;
  bool bVar2;
  reference rhs_;
  pointer ppVar3;
  reference __k;
  mapped_type *pmVar4;
  pointer ppVar5;
  _Self local_c8;
  iterator finalItEnd;
  iterator finalIt;
  _Self local_b0;
  iterator listenerItEnd;
  iterator listenerIt;
  TFileChangeListeners *listeners;
  Path local_80;
  _Self local_58;
  iterator itr;
  const_iterator fileItEnd;
  const_iterator fileIt;
  map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
  interestedListenersMap;
  FileChangeNotifier *this_local;
  
  std::
  map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
  ::map((map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
         *)&fileIt);
  fileItEnd._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->m_changedFileList);
  itr._M_node = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->m_changedFileList);
  while (bVar2 = std::operator!=(&fileItEnd,(_Self *)&itr), bVar2) {
    rhs_ = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&fileItEnd);
    FileSystemUtils::Path::Path(&local_80,rhs_);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<FileSystemUtils::Path,_std::set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_std::set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>_>_>_>
         ::find(&this->m_fileListenerMap,&local_80);
    FileSystemUtils::Path::~Path(&local_80);
    listeners = (TFileChangeListeners *)
                std::
                map<FileSystemUtils::Path,_std::set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_std::set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>_>_>_>
                ::end(&this->m_fileListenerMap);
    bVar2 = std::operator!=(&local_58,(_Self *)&listeners);
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_std::set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>_>_>
               ::operator->(&local_58);
      listenerItEnd =
           std::
           set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>
           ::begin(&ppVar3->second);
      local_b0._M_node =
           (_Base_ptr)
           std::
           set<IFileChangeListener_*,_std::less<IFileChangeListener_*>,_std::allocator<IFileChangeListener_*>_>
           ::end(&ppVar3->second);
      while (bVar2 = std::operator!=(&listenerItEnd,&local_b0), bVar2) {
        __k = std::_Rb_tree_const_iterator<IFileChangeListener_*>::operator*(&listenerItEnd);
        pmVar4 = std::
                 map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
                 ::operator[]((map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
                               *)&fileIt,__k);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator->(&fileItEnd);
        finalIt._M_node = (_Base_ptr)std::__cxx11::string::c_str();
        (*(pmVar4->super_IAUDynArray<const_char_*>)._vptr_IAUDynArray[1])(pmVar4,&finalIt);
        std::_Rb_tree_const_iterator<IFileChangeListener_*>::operator++(&listenerItEnd);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&fileItEnd);
  }
  finalItEnd = std::
               map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
               ::begin((map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
                        *)&fileIt);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
       ::end((map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
              *)&fileIt);
  while (bVar2 = std::operator!=(&finalItEnd,&local_c8), bVar2) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>::
             operator->(&finalItEnd);
    pIVar1 = ppVar5->first;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>::
             operator->(&finalItEnd);
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,&ppVar5->second);
    std::_Rb_tree_iterator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>::
    operator++(&finalItEnd);
  }
  std::
  map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
  ::~map((map<IFileChangeListener_*,_AUDynArray<const_char_*>,_std::less<IFileChangeListener_*>,_std::allocator<std::pair<IFileChangeListener_*const,_AUDynArray<const_char_*>_>_>_>
          *)&fileIt);
  return;
}

Assistant:

void FileChangeNotifier::NotifyListeners()
{
	std::map<IFileChangeListener*, AUDynArray<const char*> > interestedListenersMap;

	// Determine which listeners are interested in which changed files
	TPathNameList::const_iterator fileIt = m_changedFileList.begin();
	TPathNameList::const_iterator fileItEnd = m_changedFileList.end();
	while (fileIt != fileItEnd)
	{
		TFileListenerMap::iterator itr = m_fileListenerMap.find( *fileIt );
		if( itr != m_fileListenerMap.end() )
		{
			TFileChangeListeners& listeners = itr->second;
			TFileChangeListeners::iterator listenerIt = listeners.begin();
			TFileChangeListeners::iterator listenerItEnd = listeners.end();
			while (listenerIt != listenerItEnd)
			{
				interestedListenersMap[*listenerIt].Add(fileIt->c_str());
				++listenerIt;
			}
		}
		
		++fileIt;
	}

	// Notify each listener with an appropriate file list
	std::map<IFileChangeListener*, AUDynArray<const char*> >::iterator finalIt = interestedListenersMap.begin();
	std::map<IFileChangeListener*, AUDynArray<const char*> >::iterator finalItEnd = interestedListenersMap.end();
	while (finalIt != finalItEnd)
	{
		finalIt->first->OnFileChange(finalIt->second);	
		++finalIt;
	}
}